

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void movebubbles(void)

{
  obj *poVar1;
  monst *worm;
  level *plVar2;
  xchar xVar3;
  uint uVar4;
  bubble **ppbVar5;
  uchar *puVar6;
  container *pcVar7;
  trap *ptVar8;
  bubble *pbVar9;
  obj *poVar10;
  ulong uVar11;
  xchar xVar12;
  uint uVar13;
  monst *mon;
  uint uVar14;
  obj *otmp;
  uint local_64;
  ulong uVar15;
  
  if (wportal == (trap *)0x0) {
    wportal = (trap *)&level->lev_traps;
    do {
      wportal = wportal->ntrap;
      if (wportal == (trap *)0x0) {
        impossible("set_wportal(): no portal!");
        break;
      }
    } while ((wportal->field_0x8 & 0x1f) != 0x12);
  }
  vision_recalc(2);
  if (uball != (obj *)0x0) {
    unplacebc();
  }
  ppbVar5 = &bbubbles;
  if (bubble_up == '\0') {
    ppbVar5 = &ebubbles;
  }
  pbVar9 = *ppbVar5;
  while( true ) {
    if (pbVar9 == (bubble *)0x0) {
      bubble_up = bubble_up == '\0';
      ppbVar5 = &ebubbles;
      if ((bool)bubble_up) {
        ppbVar5 = &bbubbles;
      }
      for (pbVar9 = *ppbVar5; pbVar9 != (bubble *)0x0; pbVar9 = (&pbVar9->prev)[bubble_up != '\0'])
      {
        uVar13 = mt_random();
        uVar4 = mt_random();
        uVar14 = (uint)(uVar13 % 3 != 0);
        if (pbVar9->dx == '\0') {
          uVar14 = uVar13 % 3;
        }
        uVar13 = (uint)(uVar4 % 3 != 0);
        if (pbVar9->dy == '\0') {
          uVar13 = uVar4 % 3;
        }
        mv_bubble(level,pbVar9,((int)pbVar9->dx - uVar14) + 1,((int)pbVar9->dy - uVar13) + 1,'\0');
      }
      if (uball != (obj *)0x0) {
        placebc();
      }
      vision_full_recalc = '\x01';
      return;
    }
    if (pbVar9->cons != (container *)0x0) break;
    if (*pbVar9->bm != '\0') {
      uVar14 = (uint)pbVar9->x;
      local_64 = 0;
      do {
        uVar15 = (ulong)uVar14;
        puVar6 = pbVar9->bm;
        if (puVar6[1] != '\0') {
          uVar13 = (uint)pbVar9->y;
          uVar11 = 0;
          do {
            if ((1 << ((byte)local_64 & 0x1f) & (uint)puVar6[uVar11 + 2]) != 0) {
              if (uVar14 - 1 < 0x4f && uVar13 < 0x15) {
                xVar12 = (xchar)uVar13;
                xVar3 = (xchar)uVar14;
                if (level->objects[uVar15][uVar13] != (obj *)0x0) {
                  pcVar7 = (container *)malloc(0x18);
                  poVar1 = level->objects[uVar15][uVar13];
                  if (poVar1 == (obj *)0x0) {
                    otmp = (obj *)0x0;
                  }
                  else {
                    poVar10 = (obj *)0x0;
                    do {
                      otmp = poVar1;
                      remove_object(otmp);
                      otmp->ox = '\0';
                      otmp->oy = '\0';
                      (otmp->v).v_nexthere = poVar10;
                      poVar1 = level->objects[uVar15][uVar13];
                      poVar10 = otmp;
                    } while (poVar1 != (obj *)0x0);
                  }
                  pcVar7->x = xVar3;
                  pcVar7->y = xVar12;
                  pcVar7->what = 0;
                  pcVar7->list = otmp;
                  pcVar7->next = pbVar9->cons;
                  pbVar9->cons = pcVar7;
                }
                plVar2 = level;
                worm = level->monsters[uVar15][uVar13];
                if ((worm != (monst *)0x0) && ((worm->field_0x61 & 2) == 0)) {
                  pcVar7 = (container *)malloc(0x18);
                  pcVar7->x = xVar3;
                  pcVar7->y = xVar12;
                  pcVar7->what = 1;
                  pcVar7->list = worm;
                  pcVar7->next = pbVar9->cons;
                  pbVar9->cons = pcVar7;
                  if (worm->wormno == '\0') {
                    remove_monster(plVar2,uVar14,uVar13);
                  }
                  else {
                    remove_worm(worm);
                  }
                  newsym(uVar14,uVar13);
                  worm->mx = '\0';
                  worm->my = '\0';
                }
                if ((((u._1052_1_ & 1) == 0) && (uVar14 == (int)u.ux)) && (uVar13 == (int)u.uy)) {
                  pcVar7 = (container *)malloc(0x18);
                  pcVar7->x = xVar3;
                  pcVar7->y = xVar12;
                  pcVar7->what = 2;
                  pcVar7->list = (void *)0x0;
                  pcVar7->next = pbVar9->cons;
                  pbVar9->cons = pcVar7;
                }
                ptVar8 = t_at(level,uVar14,uVar13);
                if (ptVar8 != (trap *)0x0) {
                  pcVar7 = (container *)malloc(0x18);
                  pcVar7->x = xVar3;
                  pcVar7->y = xVar12;
                  pcVar7->what = 3;
                  pcVar7->list = ptVar8;
                  pcVar7->next = pbVar9->cons;
                  pbVar9->cons = pcVar7;
                }
                plVar2 = level;
                *(undefined8 *)(level->locations[uVar15] + uVar13) = 0x1300000014;
                *(undefined4 *)&plVar2->locations[uVar15][uVar13].field_0x8 = 0;
                block_point(uVar14,uVar13);
              }
              else {
                impossible("movebubbles: bad pos (%d,%d)",uVar15,(ulong)uVar13);
              }
            }
            uVar11 = uVar11 + 1;
            uVar13 = uVar13 + 1;
            puVar6 = pbVar9->bm;
          } while (uVar11 < puVar6[1]);
        }
        local_64 = local_64 + 1;
        uVar14 = uVar14 + 1;
      } while (local_64 < *pbVar9->bm);
    }
    pbVar9 = (&pbVar9->prev)[bubble_up != '\0'];
  }
  panic("movebubbles: cons != null");
}

Assistant:

void movebubbles(void)
{
	struct bubble *b;
	int x, y, i, j;
	struct trap *btrap;
	static const struct rm water_pos = { S_water, 0, 0, 0, 0, 0,
		WATER /* typ */, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };

	/* set up the portal the first time bubbles are moved */
	if (!wportal) set_wportal(level);

	vision_recalc(2);
	/* keep attached ball&chain separate from bubble objects */
	if (Punished) unplacebc();

	/*
	 * Pick up everything inside of a bubble then fill all bubble
	 * locations.
	 */

	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
	    if (b->cons) panic("movebubbles: cons != null");
	    for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
		for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		    if (b->bm[j + 2] & (1 << i)) {
			if (!isok(x,y)) {
			    impossible("movebubbles: bad pos (%d,%d)", x,y);
			    continue;
			}

			/* pick up objects, monsters, hero, and traps */
			if (OBJ_AT(x, y)) {
			    struct obj *olist = NULL, *otmp;
			    struct container *cons =
				malloc(sizeof(struct container));

			    while ((otmp = level->objects[x][y]) != 0) {
				remove_object(otmp);
				otmp->ox = otmp->oy = 0;
				otmp->nexthere = olist;
				olist = otmp;
			    }

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_OBJ;
			    cons->list = olist;
			    cons->next = b->cons;
			    b->cons = cons;
			}
			if (MON_AT(level, x,y)) {
			    struct monst *mon = m_at(level, x,y);
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_MON;
			    cons->list = mon;

			    cons->next = b->cons;
			    b->cons = cons;

			    if (mon->wormno)
				remove_worm(mon);
			    else
				remove_monster(level, x, y);

			    newsym(x,y);	/* clean up old position */
			    mon->mx = mon->my = 0;
			}
			if (!u.uswallow && x == u.ux && y == u.uy) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_HERO;
			    cons->list = NULL;

			    cons->next = b->cons;
			    b->cons = cons;
			}
			if ((btrap = t_at(level, x, y)) != 0) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_TRAP;
			    cons->list = btrap;

			    cons->next = b->cons;
			    b->cons = cons;
			}

			level->locations[x][y] = water_pos;
			block_point(x,y);
		    }
	}

	/*
	 * Every second time traverse down.  This is because otherwise
	 * all the junk that changes owners when bubbles overlap
	 * would eventually end up in the last bubble in the chain.
	 */

	bubble_up = !bubble_up;
	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
		int rx = rn2(3), ry = rn2(3);

		mv_bubble(level, b, b->dx + 1 - (!b->dx ? rx : (rx ? 1 : 0)),
			    b->dy + 1 - (!b->dy ? ry : (ry ? 1 : 0)),
			    FALSE);
	}

	/* put attached ball&chain back */
	if (Punished) placebc();
	vision_full_recalc = 1;
}